

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O2

void __thiscall Controller::~Controller(Controller *this)

{
  list<Person_*,_std::allocator<Person_*>_> *this_00;
  Container *pCVar1;
  Boat *this_01;
  _List_node_base *p_Var2;
  
  this_00 = &this->players;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<Person_*,_std::allocator<Person_*>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)this_00) {
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var2[1]._M_next + 0x18))();
    }
  }
  pCVar1 = &this->leftSide->super_Container;
  if (pCVar1 != (Container *)0x0) {
    Container::~Container(pCVar1);
  }
  operator_delete(pCVar1);
  pCVar1 = &this->rightSide->super_Container;
  if (pCVar1 != (Container *)0x0) {
    Container::~Container(pCVar1);
  }
  operator_delete(pCVar1);
  this_01 = this->boat;
  if (this_01 != (Boat *)0x0) {
    Container::~Container(&this_01->super_Container);
  }
  operator_delete(this_01);
  std::__cxx11::_List_base<Person_*,_std::allocator<Person_*>_>::_M_clear
            (&this_00->super__List_base<Person_*,_std::allocator<Person_*>_>);
  return;
}

Assistant:

Controller::~Controller() {
    // Removes every player
    for (Person* p : players)
        delete p;

    // Deletes the baks and boat
    delete leftSide;
    delete rightSide;
    delete boat;
}